

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cpp
# Opt level: O0

char * __thiscall
icu_63::CheckedArrayByteSink::GetAppendBuffer
          (CheckedArrayByteSink *this,int32_t min_capacity,int32_t param_2,char *scratch,
          int32_t scratch_capacity,int32_t *result_capacity)

{
  int iVar1;
  int32_t available;
  int32_t *result_capacity_local;
  int32_t scratch_capacity_local;
  char *scratch_local;
  int32_t param_2_local;
  int32_t min_capacity_local;
  CheckedArrayByteSink *this_local;
  
  if ((min_capacity < 1) || (scratch_capacity < min_capacity)) {
    *result_capacity = 0;
    this_local = (CheckedArrayByteSink *)0x0;
  }
  else {
    iVar1 = this->capacity_ - this->size_;
    if (iVar1 < min_capacity) {
      *result_capacity = scratch_capacity;
      this_local = (CheckedArrayByteSink *)scratch;
    }
    else {
      *result_capacity = iVar1;
      this_local = (CheckedArrayByteSink *)(this->outbuf_ + this->size_);
    }
  }
  return (char *)this_local;
}

Assistant:

char* CheckedArrayByteSink::GetAppendBuffer(int32_t min_capacity,
                                            int32_t /*desired_capacity_hint*/,
                                            char* scratch,
                                            int32_t scratch_capacity,
                                            int32_t* result_capacity) {
  if (min_capacity < 1 || scratch_capacity < min_capacity) {
    *result_capacity = 0;
    return NULL;
  }
  int32_t available = capacity_ - size_;
  if (available >= min_capacity) {
    *result_capacity = available;
    return outbuf_ + size_;
  } else {
    *result_capacity = scratch_capacity;
    return scratch;
  }
}